

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

bool __thiscall
vera::Scene::addBumpTexture(Scene *this,string *_name,string *_path,bool _flip,bool _verbose)

{
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  mapped_type this_00;
  mapped_type *ppTVar4;
  stat st;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
          ::find(&(this->textures)._M_t,_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->textures)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = stat((_path->_M_dataplus)._M_p,(stat *)&st);
    if (iVar1 == 0) {
      this_00 = (mapped_type)operator_new(0x48);
      ((Texture *)&this_00->_vptr_Texture)->_vptr_Texture = (_func_int **)0x0;
      (this_00->m_path)._M_dataplus._M_p = (pointer)0x0;
      (this_00->m_path)._M_string_length = 0;
      (this_00->m_path).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(this_00->m_path).field_2 + 8) = 0;
      this_00->m_width = 0;
      this_00->m_height = 0;
      this_00->m_format = 0;
      this_00->m_type = 0;
      this_00->m_filter = LINEAR;
      this_00->m_wrap = REPEAT;
      this_00->m_vFlip = false;
      *(undefined3 *)&this_00->field_0x41 = 0;
      this_00->m_id = 0;
      TextureBump::TextureBump((TextureBump *)this_00);
      iVar1 = (*((Texture *)&this_00->_vptr_Texture)->_vptr_Texture[0x10])
                        (this_00,_path,(ulong)_flip);
      if ((char)iVar1 != '\0') {
        ppTVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                  ::operator[](&this->textures,_name);
        *ppTVar4 = this_00;
        if (_verbose) {
          poVar3 = std::operator<<((ostream *)&std::cout,"// ");
          poVar3 = std::operator<<(poVar3,(string *)_path);
          poVar3 = std::operator<<(poVar3," loaded and transform to normalmap as: ");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cout,"uniform sampler2D   ");
          poVar3 = std::operator<<(poVar3,(string *)_name);
          poVar3 = std::operator<<(poVar3,";");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cout,"uniform vec2        ");
          poVar3 = std::operator<<(poVar3,(string *)_name);
          poVar3 = std::operator<<(poVar3,"Resolution;");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        return true;
      }
      (*((Texture *)&this_00->_vptr_Texture)->_vptr_Texture[1])(this_00);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error watching for file ");
      poVar3 = std::operator<<(poVar3,(string *)_path);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return false;
}

Assistant:

bool Scene::addBumpTexture(const std::string& _name, const std::string& _path, bool _flip, bool _verbose) {
    if (textures.find(_name) == textures.end()) {
        struct stat st;

        // If we can not get file stamp proably is not a file
        if (stat(_path.c_str(), &st) != 0 )
            std::cerr << "Error watching for file " << _path << std::endl;
        
        // If we can lets proceed creating a texgure
        else {
            TextureBump* tex = new TextureBump();

            // load an image into the texture
            if (tex->load(_path, _flip)) {

                // the image is loaded finish add the texture to the uniform list
                textures[_name] = (Texture*)tex;

                if (_verbose) {
                    std::cout << "// " << _path << " loaded and transform to normalmap as: " << std::endl;
                    std::cout << "uniform sampler2D   " << _name  << ";"<< std::endl;
                    std::cout << "uniform vec2        " << _name  << "Resolution;"<< std::endl;
                }

                return true;
            }
            else
                delete tex;
        }
    }
    return false;
}